

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_alloc.cpp
# Opt level: O0

void * bgetr(kmp_info_t *th,void *buf,bufsize size)

{
  kmp_info_t *in_RDX;
  void *in_RSI;
  bdhead_t *bd;
  bhead_t *b;
  bufsize osize;
  void *nbuf;
  undefined8 local_58;
  undefined8 local_30;
  undefined8 local_8;
  
  local_8 = bget((kmp_info_t *)osize,(bufsize)b);
  if (local_8 == (void *)0x0) {
    local_8 = (void *)0x0;
  }
  else if (in_RSI != (void *)0x0) {
    if (-*(long *)((long)in_RSI + -0x10) == 0) {
      local_30 = (kmp_info_t *)(*(long *)((long)in_RSI + -0x28) - 0x28);
    }
    else {
      local_30 = (kmp_info_t *)(-*(long *)((long)in_RSI + -0x10) - 0x20);
    }
    local_58 = in_RDX;
    if ((long)local_30 <= (long)in_RDX) {
      local_58 = local_30;
    }
    memcpy(local_8,in_RSI,(size_t)local_58);
    brel(in_RDX,local_8);
  }
  return local_8;
}

Assistant:

static void *bgetr(kmp_info_t *th, void *buf, bufsize size) {
  void *nbuf;
  bufsize osize; /* Old size of buffer */
  bhead_t *b;

  nbuf = bget(th, size);
  if (nbuf == NULL) { /* Acquire new buffer */
    return NULL;
  }
  if (buf == NULL) {
    return nbuf;
  }
  b = BH(((char *)buf) - sizeof(bhead_t));
  osize = -b->bb.bsize;
  if (osize == 0) {
    /*  Buffer acquired directly through acqfcn. */
    bdhead_t *bd;

    bd = BDH(((char *)buf) - sizeof(bdhead_t));
    osize = bd->tsize - (bufsize)sizeof(bdhead_t);
  } else {
    osize -= sizeof(bhead_t);
  }

  KMP_DEBUG_ASSERT(osize > 0);

  (void)KMP_MEMCPY((char *)nbuf, (char *)buf, /* Copy the data */
                   (size_t)((size < osize) ? size : osize));
  brel(th, buf);

  return nbuf;
}